

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_get_compressed_image_par(fitsfile *infptr,int *status)

{
  ulong uVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FITSfile *pFVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int tstatus;
  int colNum;
  int doffset;
  int tstatus2;
  char value [71];
  char keyword [75];
  int local_f8 [3];
  int local_ec;
  byte local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  char cStack_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  long local_98;
  long local_90;
  char local_88 [88];
  
  local_f8[1] = 0;
  if (0 < *status) {
    return *status;
  }
  iVar4 = ffgky(infptr,0x10,"ZCMPTYPE",&local_e8,(char *)0x0,status);
  if (iVar4 < 1) {
    infptr->Fptr->zcmptype[0] = '\0';
    strncat(infptr->Fptr->zcmptype,(char *)&local_e8,0xb);
    if (local_e8 == 0x47) {
      if (CONCAT13(cStack_e2,CONCAT12(cStack_e3,CONCAT11(cStack_e4,cStack_e5))) == 0x315f50 &&
          CONCAT13(cStack_e5,CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x47))) == 0x50495a47) {
        iVar4 = 0x15;
      }
      else {
        if (CONCAT13(cStack_e2,CONCAT12(cStack_e3,CONCAT11(cStack_e4,cStack_e5))) != 0x325f50 ||
            CONCAT13(cStack_e5,CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x47))) != 0x50495a47)
        goto LAB_001d0fcb;
        iVar4 = 0x16;
      }
    }
    else if (local_e8 == 0x48) {
      if (CONCAT13(cStack_dd,CONCAT12(cStack_de,CONCAT11(cStack_df,cStack_e0))) != 0x315f53 ||
          CONCAT17(cStack_e1,
                   CONCAT16(cStack_e2,
                            CONCAT15(cStack_e3,
                                     CONCAT14(cStack_e4,
                                              CONCAT13(cStack_e5,
                                                       CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x48)))
                                             )))) != 0x534552504d4f4348) goto LAB_001d0fcb;
      iVar4 = 0x29;
    }
    else if (local_e8 == 0x52) {
      iVar4 = 0xb;
      if ((CONCAT13(cStack_e2,CONCAT12(cStack_e3,CONCAT11(cStack_e4,cStack_e5))) != 0x315f45 ||
           CONCAT13(cStack_e5,CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x52))) != 0x45434952) &&
         (cStack_e0 != '\0' ||
          CONCAT17(cStack_e1,
                   CONCAT16(cStack_e2,
                            CONCAT15(cStack_e3,
                                     CONCAT14(cStack_e4,
                                              CONCAT13(cStack_e5,
                                                       CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x52)))
                                             )))) != 0x454e4f5f45434952)) goto LAB_001d0fcb;
    }
    else {
      iVar4 = 0x33;
      if (local_e8 != 0x42 ||
          CONCAT17(cStack_e1,
                   CONCAT16(cStack_e2,
                            CONCAT15(cStack_e3,
                                     CONCAT14(cStack_e4,
                                              CONCAT13(cStack_e5,
                                                       CONCAT12(cStack_e6,
                                                                CONCAT11(cStack_e7,local_e8)))))))
          != 0x315f3250495a42) {
        if (local_e8 == 0x4e) {
          if (CONCAT17(cStack_de,
                       CONCAT16(cStack_df,
                                CONCAT15(cStack_e0,
                                         CONCAT14(cStack_e1,
                                                  CONCAT13(cStack_e2,
                                                           CONCAT12(cStack_e3,
                                                                    CONCAT11(cStack_e4,cStack_e5))))
                                        ))) != 0x53534552504d4f ||
              CONCAT17(cStack_e1,
                       CONCAT16(cStack_e2,
                                CONCAT15(cStack_e3,
                                         CONCAT14(cStack_e4,
                                                  CONCAT13(cStack_e5,
                                                           CONCAT12(cStack_e6,
                                                                    CONCAT11(cStack_e7,0x4e)))))))
              != 0x4552504d4f434f4e) goto LAB_001d0fcb;
          iVar4 = -1;
        }
        else {
          if ((local_e8 != 0x50) ||
             (CONCAT13(cStack_e2,CONCAT12(cStack_e3,CONCAT11(cStack_e4,cStack_e5))) != 0x315f4f ||
              CONCAT13(cStack_e5,CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x50))) != 0x4f494c50)) {
LAB_001d0fcb:
            ffpmsg("Unknown image compression type:");
            pcVar10 = (char *)&local_e8;
            goto LAB_001d0fdc;
          }
          iVar4 = 0x1f;
        }
      }
    }
    pFVar6 = infptr->Fptr;
    pFVar6->compress_type = iVar4;
    iVar4 = ffgky(infptr,0x1f,"ZBITPIX",&pFVar6->zbitpix,(char *)0x0,status);
    if (iVar4 < 1) {
      local_f8[0] = 0;
      local_ec = 0;
      if (((infptr->Fptr->zbitpix < 0) &&
          (iVar4 = ffgcno(infptr,0,"ZZERO",local_f8 + 1,local_f8), iVar4 == 0xdb)) &&
         (iVar4 = ffgcno(infptr,0,"ZSCALE",local_f8 + 1,&local_ec), iVar4 == 0xdb)) {
LAB_001d0ff1:
        infptr->Fptr->quantize_level = 9999.0;
      }
      else {
        local_f8[0] = 0;
        iVar4 = ffgky(infptr,0x10,"ZQUANTIZ",&local_e8,(char *)0x0,local_f8);
        if (iVar4 < 1) {
          if (local_e8 == 0x53) {
            auVar14[0] = -(cStack_e3 == 'A');
            auVar14[1] = -(cStack_e2 == 'C');
            auVar14[2] = -(cStack_e1 == 'T');
            auVar14[3] = -(cStack_e0 == 'I');
            auVar14[4] = -(cStack_df == 'V');
            auVar14[5] = -(cStack_de == 'E');
            auVar14[6] = -(cStack_dd == '_');
            auVar14[7] = -(cStack_dc == 'D');
            auVar14[8] = -(cStack_db == 'I');
            auVar14[9] = -(cStack_da == 'T');
            auVar14[10] = -(cStack_d9 == 'H');
            auVar14[0xb] = -(cStack_d8 == 'E');
            auVar14[0xc] = -(cStack_d7 == 'R');
            auVar14[0xd] = -(cStack_d6 == '_');
            auVar14[0xe] = -(cStack_d5 == '1');
            auVar14[0xf] = -(cStack_d4 == '\0');
            auVar12[1] = -(cStack_e7 == 'U');
            auVar12[0] = 0xff;
            auVar12[2] = -(cStack_e6 == 'B');
            auVar12[3] = -(cStack_e5 == 'T');
            auVar12[4] = -(cStack_e4 == 'R');
            auVar12[5] = -(cStack_e3 == 'A');
            auVar12[6] = -(cStack_e2 == 'C');
            auVar12[7] = -(cStack_e1 == 'T');
            auVar12[8] = -(cStack_e0 == 'I');
            auVar12[9] = -(cStack_df == 'V');
            auVar12[10] = -(cStack_de == 'E');
            auVar12[0xb] = -(cStack_dd == '_');
            auVar12[0xc] = -(cStack_dc == 'D');
            auVar12[0xd] = -(cStack_db == 'I');
            auVar12[0xe] = -(cStack_da == 'T');
            auVar12[0xf] = -(cStack_d9 == 'H');
            auVar12 = auVar12 & auVar14;
            if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
              infptr->Fptr->quantize_method = 1;
            }
            else {
              auVar13[1] = -(cStack_e7 == 'U');
              auVar13[0] = 0xff;
              auVar13[2] = -(cStack_e6 == 'B');
              auVar13[3] = -(cStack_e5 == 'T');
              auVar13[4] = -(cStack_e4 == 'R');
              auVar13[5] = -(cStack_e3 == 'A');
              auVar13[6] = -(cStack_e2 == 'C');
              auVar13[7] = -(cStack_e1 == 'T');
              auVar13[8] = -(cStack_e0 == 'I');
              auVar13[9] = -(cStack_df == 'V');
              auVar13[10] = -(cStack_de == 'E');
              auVar13[0xb] = -(cStack_dd == '_');
              auVar13[0xc] = -(cStack_dc == 'D');
              auVar13[0xd] = -(cStack_db == 'I');
              auVar13[0xe] = -(cStack_da == 'T');
              auVar13[0xf] = -(cStack_d9 == 'H');
              auVar15[0] = -(cStack_e3 == 'A');
              auVar15[1] = -(cStack_e2 == 'C');
              auVar15[2] = -(cStack_e1 == 'T');
              auVar15[3] = -(cStack_e0 == 'I');
              auVar15[4] = -(cStack_df == 'V');
              auVar15[5] = -(cStack_de == 'E');
              auVar15[6] = -(cStack_dd == '_');
              auVar15[7] = -(cStack_dc == 'D');
              auVar15[8] = -(cStack_db == 'I');
              auVar15[9] = -(cStack_da == 'T');
              auVar15[10] = -(cStack_d9 == 'H');
              auVar15[0xb] = -(cStack_d8 == 'E');
              auVar15[0xc] = -(cStack_d7 == 'R');
              auVar15[0xd] = -(cStack_d6 == '_');
              auVar15[0xe] = -(cStack_d5 == '2');
              auVar15[0xf] = -(cStack_d4 == '\0');
              auVar15 = auVar15 & auVar13;
              if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001d107c;
              infptr->Fptr->quantize_method = 2;
            }
          }
          else {
            if (local_e8 == 0x4e) {
              if (cStack_e4 == '\0' &&
                  CONCAT13(cStack_e5,CONCAT12(cStack_e6,CONCAT11(cStack_e7,0x4e))) == 0x454e4f4e)
              goto LAB_001d0ff1;
              if (CONCAT11(cStack_df,cStack_e0) == 0x52 &&
                  CONCAT17(cStack_e1,
                           CONCAT16(cStack_e2,
                                    CONCAT15(cStack_e3,
                                             CONCAT14(cStack_e4,
                                                      CONCAT13(cStack_e5,
                                                               CONCAT12(cStack_e6,
                                                                        CONCAT11(cStack_e7,0x4e)))))
                                   )) == 0x45485449445f4f4e) {
                infptr->Fptr->quantize_method = -1;
                goto LAB_001d108a;
              }
            }
LAB_001d107c:
            infptr->Fptr->quantize_method = 0;
          }
        }
        else {
          pFVar6 = infptr->Fptr;
          pFVar6->quantize_level = 0.0;
          pFVar6->quantize_method = 0;
        }
      }
LAB_001d108a:
      local_f8[0] = 0;
      iVar5 = ffgky(infptr,0x1f,"ZDITHER0",local_f8 + 2,(char *)0x0,local_f8);
      iVar4 = 1;
      if (iVar5 < 1) {
        iVar4 = local_f8[2];
      }
      pFVar6 = infptr->Fptr;
      pFVar6->dither_seed = iVar4;
      iVar4 = ffgky(infptr,0x1f,"ZNAXIS",&pFVar6->zndim,(char *)0x0,status);
      if (iVar4 < 1) {
        uVar3 = infptr->Fptr->zndim;
        if ((int)uVar3 < 1) {
          pcVar10 = "Compressed image has no data (ZNAXIS < 1)";
LAB_001d111b:
          ffpmsg(pcVar10);
          *status = 0xd4;
          return 0xd4;
        }
        if (6 < uVar3) {
          pcVar10 = "Compressed image has too many dimensions";
          goto LAB_001d111b;
        }
        lVar9 = 1;
        lVar8 = 0x440;
        lVar7 = 1;
        uVar11 = 0;
        do {
          uVar1 = uVar11 + 1;
          local_98 = lVar7;
          local_90 = lVar9;
          snprintf(local_88,0x4b,"ZNAXIS%d",uVar1 & 0xffffffff);
          ffgky(infptr,0x29,local_88,(void *)((long)infptr->Fptr->imgnaxis + lVar8 + -0x40),
                (char *)0x0,status);
          if (0 < *status) {
            pcVar10 = "required ZNAXISn compression keyword not found";
            goto LAB_001d0d13;
          }
          snprintf(local_88,0x4b,"ZTILE%d",uVar1 & 0xffffffff);
          pFVar6 = infptr->Fptr;
          if (uVar11 == 0) {
            pFVar6->tilesize[0] = pFVar6->znaxis[0];
          }
          else {
            pFVar6->tilesize[uVar11] = 1;
          }
          local_f8[0] = 0;
          ffgky(infptr,0x29,local_88,(void *)((long)&pFVar6->filehandle + lVar8),(char *)0x0,
                local_f8);
          pFVar6 = infptr->Fptr;
          lVar9 = pFVar6->tilesize[uVar11];
          if (lVar9 == 0) {
            pcVar10 = "invalid ZTILE value = 0 in compressed image";
            goto LAB_001d0fdc;
          }
          lVar7 = local_98 * ((pFVar6->znaxis[uVar11] + -1) / lVar9 + 1);
          lVar9 = local_90 * lVar9;
          lVar8 = lVar8 + 8;
          uVar11 = uVar1;
        } while ((long)uVar1 < (long)pFVar6->zndim);
        if (lVar7 - pFVar6->numrows != 0) {
          pcVar10 = "number of table rows != the number of tiles in compressed image";
          goto LAB_001d0fdc;
        }
        if (pFVar6->compress_type == 0x29) {
          iVar4 = ffgky(infptr,0x2a,"ZVAL1",&pFVar6->hcomp_scale,(char *)0x0,status);
          if (0 < iVar4) {
LAB_001d1385:
            pcVar10 = "required ZVAL1 compression keyword not found";
            goto LAB_001d0d13;
          }
          local_f8[0] = 0;
          ffgky(infptr,0x1f,"ZVAL2",&infptr->Fptr->hcomp_smooth,(char *)0x0,local_f8);
          pFVar6 = infptr->Fptr;
        }
        else if (pFVar6->compress_type == 0xb) {
          iVar4 = ffgky(infptr,0x1f,"ZVAL1",&pFVar6->rice_blocksize,(char *)0x0,status);
          if (0 < iVar4) goto LAB_001d1385;
          local_f8[0] = 0;
          iVar4 = ffgky(infptr,0x10,"ZNAME2",&local_e8,(char *)0x0,local_f8);
          if (((iVar4 == 0) && (local_e8 == 0x4e)) &&
             (local_f8[0] = 0,
             cStack_e0 == '\0' &&
             CONCAT17(cStack_e1,
                      CONCAT16(cStack_e2,
                               CONCAT15(cStack_e3,
                                        CONCAT14(cStack_e4,
                                                 CONCAT13(cStack_e5,
                                                          CONCAT12(cStack_e6,
                                                                   CONCAT11(cStack_e7,0x4e))))))) ==
             0x5449424553494f4e)) {
LAB_001d13ef:
            pFVar6 = infptr->Fptr;
            pFVar6->rice_bytepix = 4;
          }
          else {
            local_f8[0] = 0;
            iVar4 = ffgky(infptr,0x1f,"ZVAL2",&infptr->Fptr->rice_bytepix,(char *)0x0,local_f8);
            if (0 < iVar4) goto LAB_001d13ef;
            pFVar6 = infptr->Fptr;
          }
          if ((pFVar6->rice_blocksize < 0x10) && (iVar4 = pFVar6->rice_bytepix, 8 < iVar4)) {
            pFVar6->rice_bytepix = pFVar6->rice_blocksize;
            pFVar6->rice_blocksize = iVar4;
            local_f8[0] = iVar4;
          }
        }
        pFVar6->maxtilelen = lVar9;
        if (pFVar6->compress_type == 0xb && pFVar6->rice_blocksize == 0) {
          pcVar10 = "Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)";
LAB_001d0fdc:
          ffpmsg(pcVar10);
          *status = 0x19e;
          return 0x19e;
        }
        iVar4 = imcomp_calc_max_elem
                          (pFVar6->compress_type,(int)lVar9,pFVar6->zbitpix,pFVar6->rice_blocksize);
        pFVar6->maxelem = (long)iVar4;
        iVar4 = ffgcno(infptr,0,"COMPRESSED_DATA",&pFVar6->cn_compressed,status);
        if (0 < iVar4) {
          pcVar10 = "couldn\'t find COMPRESSED_DATA column (fits_get_compressed_img_par)";
          goto LAB_001d0fdc;
        }
        ffpmrk();
        local_f8[0] = 0;
        ffgcno(infptr,0,"UNCOMPRESSED_DATA",&infptr->Fptr->cn_uncompressed,local_f8);
        local_f8[0] = 0;
        ffgcno(infptr,0,"GZIP_COMPRESSED_DATA",&infptr->Fptr->cn_gzip_data,local_f8);
        local_f8[0] = 0;
        iVar4 = ffgcno(infptr,0,"ZSCALE",&infptr->Fptr->cn_zscale,local_f8);
        pFVar6 = infptr->Fptr;
        if (0 < iVar4) {
          local_f8[0] = 0;
          iVar4 = ffgky(infptr,0x52,"ZSCALE",&pFVar6->zscale,(char *)0x0,local_f8);
          pFVar6 = infptr->Fptr;
          if (iVar4 < 1) {
            pFVar6->cn_zscale = -1;
          }
        }
        local_f8[0] = 0;
        iVar4 = ffgcno(infptr,0,"ZZERO",&pFVar6->cn_zzero,local_f8);
        pFVar6 = infptr->Fptr;
        if (0 < iVar4) {
          local_f8[0] = 0;
          iVar4 = ffgky(infptr,0x52,"ZZERO",&pFVar6->zzero,(char *)0x0,local_f8);
          pFVar6 = infptr->Fptr;
          if (iVar4 < 1) {
            pFVar6->cn_zzero = -1;
          }
        }
        local_f8[0] = 0;
        iVar4 = ffgcno(infptr,0,"ZBLANK",&pFVar6->cn_zblank,local_f8);
        pFVar6 = infptr->Fptr;
        if (0 < iVar4) {
          local_f8[0] = 0;
          iVar4 = ffgky(infptr,0x1f,"ZBLANK",&pFVar6->zblank,(char *)0x0,local_f8);
          if (iVar4 < 1) {
            pFVar6 = infptr->Fptr;
          }
          else {
            local_f8[0] = 0;
            iVar4 = ffgky(infptr,0x1f,"BLANK",&infptr->Fptr->zblank,(char *)0x0,local_f8);
            pFVar6 = infptr->Fptr;
            if (0 < iVar4) goto LAB_001d165b;
          }
          pFVar6->cn_zblank = -1;
        }
LAB_001d165b:
        local_f8[0] = 0;
        iVar4 = ffgky(infptr,0x52,"BSCALE",&pFVar6->cn_bscale,(char *)0x0,local_f8);
        pFVar6 = infptr->Fptr;
        if (0 < iVar4) {
          pFVar6->cn_bscale = 1.0;
        }
        local_f8[0] = 0;
        iVar4 = ffgky(infptr,0x52,"BZERO",&pFVar6->cn_bzero,(char *)0x0,local_f8);
        pFVar6 = infptr->Fptr;
        if (iVar4 < 1) {
          pFVar6->cn_actual_bzero = pFVar6->cn_bzero;
        }
        else {
          pFVar6->cn_bzero = 0.0;
          pFVar6->cn_actual_bzero = 0.0;
        }
        fVar2 = pFVar6->request_quantize_level;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          pFVar6->quantize_level = fVar2;
        }
        ffcmrk();
        goto LAB_001d0d18;
      }
      pcVar10 = "required ZNAXIS compression keyword not found";
    }
    else {
      pcVar10 = "required ZBITPIX compression keyword not found";
    }
  }
  else {
    ffpmsg("required ZCMPTYPE compression keyword not found in");
    pcVar10 = " imcomp_get_compressed_image_par";
  }
LAB_001d0d13:
  ffpmsg(pcVar10);
LAB_001d0d18:
  return *status;
}

Assistant:

int imcomp_get_compressed_image_par(fitsfile *infptr, int *status)
 
/* 
    This routine reads keywords from a BINTABLE extension containing a
    compressed image.
*/
{
    char keyword[FLEN_KEYWORD];
    char value[FLEN_VALUE];
    int ii, tstatus, tstatus2, doffset, oldFormat=0, colNum=0;
    long expect_nrows, maxtilelen;

    if (*status > 0)
        return(*status);

    /* Copy relevant header keyword values to structure */
    if (ffgky (infptr, TSTRING, "ZCMPTYPE", value, NULL, status) > 0)
    {
        ffpmsg("required ZCMPTYPE compression keyword not found in");
        ffpmsg(" imcomp_get_compressed_image_par");
        return(*status);
    }

    (infptr->Fptr)->zcmptype[0] = '\0';
    strncat((infptr->Fptr)->zcmptype, value, 11);

    if (!FSTRCMP(value, "RICE_1") || !FSTRCMP(value, "RICE_ONE") )
        (infptr->Fptr)->compress_type = RICE_1;
    else if (!FSTRCMP(value, "HCOMPRESS_1") )
        (infptr->Fptr)->compress_type = HCOMPRESS_1;
    else if (!FSTRCMP(value, "GZIP_1") )
        (infptr->Fptr)->compress_type = GZIP_1;
    else if (!FSTRCMP(value, "GZIP_2") )
        (infptr->Fptr)->compress_type = GZIP_2;
    else if (!FSTRCMP(value, "BZIP2_1") )
        (infptr->Fptr)->compress_type = BZIP2_1;
    else if (!FSTRCMP(value, "PLIO_1") )
        (infptr->Fptr)->compress_type = PLIO_1;
    else if (!FSTRCMP(value, "NOCOMPRESS") )
        (infptr->Fptr)->compress_type = NOCOMPRESS;
    else
    {
        ffpmsg("Unknown image compression type:");
        ffpmsg(value);
	return (*status = DATA_DECOMPRESSION_ERR);
    }
    
    if (ffgky (infptr, TINT,  "ZBITPIX",  &(infptr->Fptr)->zbitpix,  
               NULL, status) > 0)
    {
        ffpmsg("required ZBITPIX compression keyword not found");
        return(*status);
    }

    /* If ZZERO and ZSCALE columns don't exist for floating-point types,
     assume there is NO quantization.  Treat exactly as if it had ZQUANTIZ='NONE'.
     This is true regardless of whether or not file has a ZQUANTIZ keyword. */
    tstatus=0;
    tstatus2=0;
    if ((infptr->Fptr->zbitpix < 0) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZZERO",&colNum,&tstatus)
	      == COL_NOT_FOUND) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZSCALE",&colNum,&tstatus2)
	      == COL_NOT_FOUND)) {
	  (infptr->Fptr)->quantize_level = NO_QUANTIZE;
    }
    else {
       /* get the floating point to integer quantization type, if present. */
       /* FITS files produced before 2009 will not have this keyword */
       tstatus = 0;
       if (ffgky(infptr, TSTRING, "ZQUANTIZ", value, NULL, &tstatus) > 0)
       {
           (infptr->Fptr)->quantize_method = 0;
           (infptr->Fptr)->quantize_level = 0;
       } else {

           if (!FSTRCMP(value, "NONE") ) {
               (infptr->Fptr)->quantize_level = NO_QUANTIZE;
	  } else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_1") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_1;
           else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_2") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_2;
           else if (!FSTRCMP(value, "NO_DITHER") )
               (infptr->Fptr)->quantize_method = NO_DITHER;
           else
               (infptr->Fptr)->quantize_method = 0;
       }
    }

    /* get the floating point quantization dithering offset, if present. */
    /* FITS files produced before October 2009 will not have this keyword */
    tstatus = 0;
    if (ffgky(infptr, TINT, "ZDITHER0", &doffset, NULL, &tstatus) > 0)
    {
	/* by default start with 1st element of random sequence */
        (infptr->Fptr)->dither_seed = 1;  
    } else {
        (infptr->Fptr)->dither_seed = doffset;
    }

    if (ffgky (infptr,TINT, "ZNAXIS", &(infptr->Fptr)->zndim, NULL, status) > 0)
    {
        ffpmsg("required ZNAXIS compression keyword not found");
        return(*status);
    }

    if ((infptr->Fptr)->zndim < 1)
    {
        ffpmsg("Compressed image has no data (ZNAXIS < 1)");
	return (*status = BAD_NAXIS);
    }

    if ((infptr->Fptr)->zndim > MAX_COMPRESS_DIM)
    {
        ffpmsg("Compressed image has too many dimensions");
        return(*status = BAD_NAXIS);
    }

    expect_nrows = 1;
    maxtilelen = 1;
    for (ii = 0;  ii < (infptr->Fptr)->zndim;  ii++)
    {
        /* get image size */
        snprintf (keyword, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
	ffgky (infptr, TLONG,keyword, &(infptr->Fptr)->znaxis[ii],NULL,status);

        if (*status > 0)
        {
            ffpmsg("required ZNAXISn compression keyword not found");
            return(*status);
        }

        /* get compression tile size */
	snprintf (keyword, FLEN_KEYWORD,"ZTILE%d", ii+1);

        /* set default tile size in case keywords are not present */
        if (ii == 0)
            (infptr->Fptr)->tilesize[0] = (infptr->Fptr)->znaxis[0];
        else
            (infptr->Fptr)->tilesize[ii] = 1;

        tstatus = 0;
	ffgky (infptr, TLONG, keyword, &(infptr->Fptr)->tilesize[ii], NULL, 
               &tstatus);
        if ((infptr->Fptr)->tilesize[ii] == 0)
        {
           ffpmsg("invalid ZTILE value = 0 in compressed image");
           return (*status = DATA_DECOMPRESSION_ERR);
        }
        expect_nrows *= (((infptr->Fptr)->znaxis[ii] - 1) / 
                  (infptr->Fptr)->tilesize[ii]+ 1);
        maxtilelen *= (infptr->Fptr)->tilesize[ii];
    }

    /* check number of rows */
    if (expect_nrows != (infptr->Fptr)->numrows)
    {
        ffpmsg(
        "number of table rows != the number of tiles in compressed image");
        return (*status = DATA_DECOMPRESSION_ERR);
    }

    /* read any algorithm specific parameters */
    if ((infptr->Fptr)->compress_type == RICE_1 )
    {
        if (ffgky(infptr, TINT,"ZVAL1", &(infptr->Fptr)->rice_blocksize,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        /* First check for very old files, where ZVAL2 wasn't yet designated
           for bytepix */
        if (!ffgky(infptr, TSTRING, "ZNAME2", value, NULL, &tstatus)
                && !FSTRCMP(value, "NOISEBIT"))
        {
            oldFormat = 1;
        }
                
        tstatus = 0;
        if (oldFormat || ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->rice_bytepix,
                  NULL, &tstatus) > 0)
        {
            (infptr->Fptr)->rice_bytepix = 4;  /* default value */
        }

        if ((infptr->Fptr)->rice_blocksize < 16 &&
	    (infptr->Fptr)->rice_bytepix > 8) {
	     /* values are reversed */
	     tstatus = (infptr->Fptr)->rice_bytepix;
	     (infptr->Fptr)->rice_bytepix = (infptr->Fptr)->rice_blocksize;
	     (infptr->Fptr)->rice_blocksize = tstatus;
        }
    } else if ((infptr->Fptr)->compress_type == HCOMPRESS_1 ) {

        if (ffgky(infptr, TFLOAT,"ZVAL1", &(infptr->Fptr)->hcomp_scale,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->hcomp_smooth,
                  NULL, &tstatus);
    }    

    /* store number of pixels in each compression tile, */
    /* and max size of the compressed tile buffer */
    (infptr->Fptr)->maxtilelen = maxtilelen;

    /* prevent possible divide by zero in imcomp_calc_max_elem */
    if ((infptr->Fptr)->compress_type == RICE_1 && 
        (infptr->Fptr)->rice_blocksize == 0)
    {
        ffpmsg("Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }
    (infptr->Fptr)->maxelem = 
           imcomp_calc_max_elem ((infptr->Fptr)->compress_type, maxtilelen, 
               (infptr->Fptr)->zbitpix, (infptr->Fptr)->rice_blocksize);

    /* Get Column numbers. */
    if (ffgcno(infptr, CASEINSEN, "COMPRESSED_DATA",
         &(infptr->Fptr)->cn_compressed, status) > 0)
    {
        ffpmsg("couldn't find COMPRESSED_DATA column (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    ffpmrk(); /* put mark on message stack; erase any messages after this */

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "UNCOMPRESSED_DATA",
          &(infptr->Fptr)->cn_uncompressed, &tstatus);

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "GZIP_COMPRESSED_DATA",
          &(infptr->Fptr)->cn_gzip_data, &tstatus);

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZSCALE", &(infptr->Fptr)->cn_zscale,
              &tstatus) > 0)
    {
        /* CMPSCALE column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZSCALE", &(infptr->Fptr)->zscale, NULL, 
                 &tstatus) <= 0)
            (infptr->Fptr)->cn_zscale = -1;  /* flag for a constant ZSCALE */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZZERO", &(infptr->Fptr)->cn_zzero,
               &tstatus) > 0)
    {
        /* CMPZERO column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZZERO", &(infptr->Fptr)->zzero, NULL, 
                  &tstatus) <= 0)
            (infptr->Fptr)->cn_zzero = -1;  /* flag for a constant ZZERO */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZBLANK", &(infptr->Fptr)->cn_zblank,
               &tstatus) > 0)
    {
        /* ZBLANK column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TINT, "ZBLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  {
            (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */

        } else {
           /* ZBLANK keyword doesn't exist; see if there is a BLANK keyword */
           tstatus = 0;
           if (ffgky(infptr, TINT, "BLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  
              (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }
    }

    /* read the conventional BSCALE and BZERO scaling keywords, if present */
    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BSCALE", &(infptr->Fptr)->cn_bscale, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bscale = 1.0;
    }

    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BZERO", &(infptr->Fptr)->cn_bzero, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bzero = 0.0;
        (infptr->Fptr)->cn_actual_bzero = 0.0;
    } else {
        (infptr->Fptr)->cn_actual_bzero = (infptr->Fptr)->cn_bzero;
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
    if ( (infptr->Fptr)->request_quantize_level != 0.)
        (infptr->Fptr)->quantize_level = (infptr->Fptr)->request_quantize_level;

    ffcmrk();  /* clear any spurious error messages, back to the mark */
    return (*status);
}